

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_finishget(lua_State *L,TValue *t,TValue *key,StkId val,TValue *slot)

{
  undefined4 uVar1;
  TValue *local_58;
  TValue *local_50;
  TValue *io1;
  TValue *tm;
  TValue *pTStack_30;
  int loop;
  TValue *slot_local;
  StkId val_local;
  TValue *key_local;
  TValue *t_local;
  lua_State *L_local;
  
  tm._4_4_ = 0;
  pTStack_30 = slot;
  key_local = t;
  do {
    if (1999 < tm._4_4_) {
      luaG_runerror(L,"\'__index\' chain too long; possible loop");
    }
    if (pTStack_30 == (TValue *)0x0) {
      io1 = luaT_gettmbyobj(L,key_local,TM_INDEX);
      if (io1->tt_ == 0) {
        luaG_typeerror(L,key_local,"index");
      }
    }
    else {
      if (*(long *)((key_local->value_).f + 0x28) == 0) {
        local_50 = (TValue *)0x0;
      }
      else {
        if ((*(byte *)(*(long *)((key_local->value_).f + 0x28) + 10) & 1) == 0) {
          local_58 = luaT_gettm(*(Table **)((key_local->value_).f + 0x28),TM_INDEX,L->l_G->tmname[0]
                               );
        }
        else {
          local_58 = (TValue *)0x0;
        }
        local_50 = local_58;
      }
      io1 = local_50;
      if (local_50 == (TValue *)0x0) {
        val->tt_ = 0;
        return;
      }
    }
    if ((io1->tt_ & 0xfU) == 6) {
      luaT_callTM(L,io1,key_local,key,val,1);
      return;
    }
    key_local = io1;
    if (io1->tt_ == 0x45) {
      pTStack_30 = luaH_get((Table *)(io1->value_).gc,key);
      if (pTStack_30->tt_ != 0) {
        val->value_ = pTStack_30->value_;
        uVar1 = *(undefined4 *)&pTStack_30->field_0xc;
        val->tt_ = pTStack_30->tt_;
        *(undefined4 *)&val->field_0xc = uVar1;
        return;
      }
    }
    else {
      pTStack_30 = (TValue *)0x0;
    }
    tm._4_4_ = tm._4_4_ + 1;
  } while( true );
}

Assistant:

void luaV_finishget(lua_State *L, const TValue *t, TValue *key, StkId val,
                    const TValue *slot) {
    int loop;  /* counter to avoid infinite loops */
    const TValue *tm;  /* metamethod */
    for (loop = 0; loop < MAXTAGLOOP; loop++) {
        if (slot == NULL) {  /* 't' is not a table? */
            lua_assert(!ttistable(t));
            tm = luaT_gettmbyobj(L, t, TM_INDEX);
            if (ttisnil(tm))
                luaG_typeerror(L, t, "index");  /* no metamethod */
            /* else will try the metamethod */
        } else {  /* 't' is a table */
            lua_assert(ttisnil(slot));
            tm = fasttm(L, hvalue(t)->metatable, TM_INDEX);  /* table's metamethod */
            if (tm == NULL) {  /* no metamethod? */
                setnilvalue(val);  /* result is nil */
                return;
            }
            /* else will try the metamethod */
        }
        if (ttisfunction(tm)) {  /* is metamethod a function? */
            luaT_callTM(L, tm, t, key, val, 1);  /* call it */
            return;
        }
        t = tm;  /* else try to access 'tm[key]' */
        if (luaV_fastget(L, t, key, slot, luaH_get)) {  /* fast track? */
            setobj2s(L, val, slot);  /* done */
            return;
        }
        /* else repeat (tail call 'luaV_finishget') */
    }
    luaG_runerror(L, "'__index' chain too long; possible loop");
}